

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDocumentation.cxx
# Opt level: O1

bool __thiscall
cmDocumentation::CheckOptions(cmDocumentation *this,int argc,char **argv,char *exitOpt)

{
  char *pcVar1;
  bool bVar2;
  size_type sVar3;
  undefined8 uVar4;
  bool bVar5;
  byte bVar6;
  int iVar7;
  cmDocumentation *pcVar8;
  cmDocumentation *pcVar9;
  int iVar10;
  bool result;
  RequestedHelpItem help;
  bool local_a9;
  undefined1 local_a8 [8];
  string local_a0;
  undefined1 local_80 [32];
  string local_60;
  _Base_ptr local_40;
  _Base_ptr local_38;
  
  if (argc == 1) {
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    local_80._8_8_ = (pointer)0x0;
    local_80[0x10] = '\0';
    local_a8._0_4_ = Usage;
    local_a0._M_dataplus._M_p = local_a8 + 0x18;
    local_80._0_8_ = local_80 + 0x10;
    std::
    vector<cmDocumentation::RequestedHelpItem,_std::allocator<cmDocumentation::RequestedHelpItem>_>
    ::push_back(&this->RequestedHelpItems,(value_type *)local_a8);
    if ((undefined1 *)local_80._0_8_ != local_80 + 0x10) {
      operator_delete((void *)local_80._0_8_,CONCAT71(local_80._17_7_,local_80[0x10]) + 1);
    }
    if (local_a0._M_dataplus._M_p != local_a8 + 0x18) {
      operator_delete(local_a0._M_dataplus._M_p,
                      CONCAT71(local_a0.field_2._M_allocated_capacity._1_7_,
                               local_a0.field_2._M_local_buf[0]) + 1);
    }
    local_a9 = (bool)1;
  }
  else {
    local_a9 = false;
    bVar2 = 1 < argc;
    bVar6 = 1;
    if (1 < argc) {
      local_40 = (_Base_ptr)&this->RequestedHelpItems;
      iVar10 = 1;
      local_38 = (_Base_ptr)exitOpt;
      do {
        if ((local_38 != (_Base_ptr)0x0) &&
           (iVar7 = strcmp(argv[iVar10],(char *)local_38), bVar6 = local_a9, iVar7 == 0))
        goto LAB_0025dc3d;
        local_a8._0_4_ = None;
        local_a0._M_dataplus._M_p = local_a8 + 0x18;
        local_a0._M_string_length = 0;
        local_a0.field_2._M_local_buf[0] = '\0';
        local_80._0_8_ = local_80 + 0x10;
        local_80._8_8_ = (char *)0x0;
        local_80[0x10] = '\0';
        pcVar9 = (cmDocumentation *)argv[iVar10];
        pcVar8 = pcVar9;
        iVar7 = strcmp((char *)pcVar9,"-help");
        if ((iVar7 == 0) ||
           ((((pcVar8 = pcVar9, iVar7 = strcmp((char *)pcVar9,"--help"), iVar7 == 0 ||
              (pcVar8 = pcVar9, iVar7 = strcmp((char *)pcVar9,"/?"), iVar7 == 0)) ||
             (pcVar8 = pcVar9, iVar7 = strcmp((char *)pcVar9,"-usage"), iVar7 == 0)) ||
            ((pcVar8 = pcVar9, iVar7 = strcmp((char *)pcVar9,"-h"), iVar7 == 0 ||
             (pcVar8 = pcVar9, iVar7 = strcmp((char *)pcVar9,"-H"), iVar7 == 0)))))) {
          local_a8._0_4_ = Help;
          iVar7 = iVar10 + 1;
          if (iVar7 < argc) {
            pcVar1 = argv[iVar7];
            bVar5 = IsOption(pcVar8,pcVar1);
            uVar4 = local_80._8_8_;
            if (!bVar5) {
              strlen(pcVar1);
              std::__cxx11::string::_M_replace((ulong)local_80,0,(char *)uVar4,(ulong)pcVar1);
              iVar10 = iVar7;
            }
          }
          cmsys::SystemTools::LowerCase(&local_60,(string *)local_80);
          std::__cxx11::string::operator=((string *)local_80,(string *)&local_60);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_60._M_dataplus._M_p != &local_60.field_2) {
            operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
          }
          if ((char *)local_80._8_8_ != (char *)0x0) {
            local_a8._0_4_ = OneCommand;
          }
LAB_0025d33b:
          bVar5 = true;
          if (local_a8._0_4_ != None) {
            local_a9 = true;
            std::
            vector<cmDocumentation::RequestedHelpItem,_std::allocator<cmDocumentation::RequestedHelpItem>_>
            ::push_back((vector<cmDocumentation::RequestedHelpItem,_std::allocator<cmDocumentation::RequestedHelpItem>_>
                         *)local_40,(value_type *)local_a8);
          }
        }
        else {
          iVar7 = strcmp((char *)pcVar9,"--help-properties");
          if (iVar7 == 0) {
            local_a8._0_4_ = OneManual;
            pcVar9 = (cmDocumentation *)local_80;
            std::__cxx11::string::_M_replace((ulong)pcVar9,0,(char *)local_80._8_8_,0x555abb);
            iVar7 = iVar10 + 1;
            if (iVar7 < argc) {
              pcVar1 = argv[iVar7];
              bVar5 = IsOption(pcVar9,pcVar1);
              sVar3 = local_a0._M_string_length;
              if (!bVar5) {
                strlen(pcVar1);
                std::__cxx11::string::_M_replace
                          ((ulong)(local_a8 + 8),0,(char *)sVar3,(ulong)pcVar1);
                iVar10 = iVar7;
              }
            }
            WarnFormFromFilename((RequestedHelpItem *)local_a8,&local_a9);
            goto LAB_0025d33b;
          }
          iVar7 = strcmp((char *)pcVar9,"--help-policies");
          if (iVar7 == 0) {
            local_a8._0_4_ = OneManual;
            pcVar9 = (cmDocumentation *)local_80;
            std::__cxx11::string::_M_replace((ulong)pcVar9,0,(char *)local_80._8_8_,0x555ade);
            iVar7 = iVar10 + 1;
            if (iVar7 < argc) {
              pcVar1 = argv[iVar7];
              bVar5 = IsOption(pcVar9,pcVar1);
              sVar3 = local_a0._M_string_length;
              if (!bVar5) {
                strlen(pcVar1);
                std::__cxx11::string::_M_replace
                          ((ulong)(local_a8 + 8),0,(char *)sVar3,(ulong)pcVar1);
                iVar10 = iVar7;
              }
            }
            WarnFormFromFilename((RequestedHelpItem *)local_a8,&local_a9);
            goto LAB_0025d33b;
          }
          iVar7 = strcmp((char *)pcVar9,"--help-variables");
          if (iVar7 == 0) {
            local_a8._0_4_ = OneManual;
            pcVar9 = (cmDocumentation *)local_80;
            std::__cxx11::string::_M_replace((ulong)pcVar9,0,(char *)local_80._8_8_,0x555b00);
            iVar7 = iVar10 + 1;
            if (iVar7 < argc) {
              pcVar1 = argv[iVar7];
              bVar5 = IsOption(pcVar9,pcVar1);
              if (!bVar5) {
                std::__cxx11::string::operator=((string *)(local_a8 + 8),pcVar1);
                iVar10 = iVar7;
              }
            }
            WarnFormFromFilename((RequestedHelpItem *)local_a8,&local_a9);
            goto LAB_0025d33b;
          }
          iVar7 = strcmp((char *)pcVar9,"--help-modules");
          if (iVar7 == 0) {
            local_a8._0_4_ = OneManual;
            pcVar9 = (cmDocumentation *)local_80;
            std::__cxx11::string::_M_replace((ulong)pcVar9,0,(char *)local_80._8_8_,0x555b21);
            iVar7 = iVar10 + 1;
            if (iVar7 < argc) {
              pcVar1 = argv[iVar7];
              bVar5 = IsOption(pcVar9,pcVar1);
              if (!bVar5) {
                std::__cxx11::string::operator=((string *)(local_a8 + 8),pcVar1);
                iVar10 = iVar7;
              }
            }
            WarnFormFromFilename((RequestedHelpItem *)local_a8,&local_a9);
            goto LAB_0025d33b;
          }
          pcVar8 = pcVar9;
          iVar7 = strcmp((char *)pcVar9,"--help-custom-modules");
          if (iVar7 == 0) {
            iVar7 = iVar10 + 1;
            if (iVar7 < argc) {
              pcVar1 = argv[iVar7];
              bVar5 = IsOption(pcVar8,pcVar1);
              if (!bVar5) {
                std::__cxx11::string::operator=((string *)(local_a8 + 8),pcVar1);
                iVar10 = iVar7;
              }
            }
            cmSystemTools::Message("Warning: --help-custom-modules no longer supported",(char *)0x0)
            ;
            if ((char *)local_a0._M_string_length == (char *)0x0) {
              bVar5 = false;
              goto LAB_0025d359;
            }
            local_a8._0_4_ = OldCustomModules;
            cmsys::SystemTools::GetFilenameName(&local_60,(string *)(local_a8 + 8));
            std::__cxx11::string::operator=((string *)local_80,(string *)&local_60);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_60._M_dataplus._M_p != &local_60.field_2) {
              operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
            }
            goto LAB_0025d33b;
          }
          iVar7 = strcmp((char *)pcVar9,"--help-commands");
          if (iVar7 == 0) {
            local_a8._0_4_ = OneManual;
            pcVar9 = (cmDocumentation *)local_80;
            std::__cxx11::string::operator=((string *)pcVar9,"cmake-commands.7");
            iVar7 = iVar10 + 1;
            if (iVar7 < argc) {
              pcVar1 = argv[iVar7];
              bVar5 = IsOption(pcVar9,pcVar1);
              if (!bVar5) {
                std::__cxx11::string::operator=((string *)(local_a8 + 8),pcVar1);
                iVar10 = iVar7;
              }
            }
            WarnFormFromFilename((RequestedHelpItem *)local_a8,&local_a9);
            goto LAB_0025d33b;
          }
          pcVar8 = pcVar9;
          iVar7 = strcmp((char *)pcVar9,"--help-compatcommands");
          if (iVar7 == 0) {
            iVar7 = iVar10 + 1;
            if (iVar7 < argc) {
              pcVar1 = argv[iVar7];
              bVar5 = IsOption(pcVar8,pcVar1);
              if (!bVar5) {
                std::__cxx11::string::operator=((string *)(local_a8 + 8),pcVar1);
                iVar10 = iVar7;
              }
            }
            bVar5 = false;
            cmSystemTools::Message("Warning: --help-compatcommands no longer supported",(char *)0x0)
            ;
          }
          else {
            pcVar8 = pcVar9;
            iVar7 = strcmp((char *)pcVar9,"--help-full");
            if (iVar7 == 0) {
              local_a8._0_4_ = Full;
              iVar7 = iVar10 + 1;
              if (iVar7 < argc) {
                pcVar1 = argv[iVar7];
                bVar5 = IsOption(pcVar8,pcVar1);
                if (!bVar5) {
                  std::__cxx11::string::operator=((string *)(local_a8 + 8),pcVar1);
                  iVar10 = iVar7;
                }
              }
              WarnFormFromFilename((RequestedHelpItem *)local_a8,&local_a9);
              goto LAB_0025d33b;
            }
            pcVar8 = pcVar9;
            iVar7 = strcmp((char *)pcVar9,"--help-html");
            if (iVar7 == 0) {
              iVar7 = iVar10 + 1;
              if (iVar7 < argc) {
                pcVar1 = argv[iVar7];
                bVar5 = IsOption(pcVar8,pcVar1);
                if (!bVar5) {
                  std::__cxx11::string::operator=((string *)(local_a8 + 8),pcVar1);
                  iVar10 = iVar7;
                }
              }
              bVar5 = false;
              cmSystemTools::Message("Warning: --help-html no longer supported",(char *)0x0);
            }
            else {
              pcVar8 = pcVar9;
              iVar7 = strcmp((char *)pcVar9,"--help-man");
              if (iVar7 != 0) {
                pcVar8 = pcVar9;
                iVar7 = strcmp((char *)pcVar9,"--help-command");
                if (iVar7 == 0) {
                  local_a8._0_4_ = OneCommand;
                  iVar7 = iVar10 + 1;
                  if (iVar7 < argc) {
                    pcVar1 = argv[iVar7];
                    bVar5 = IsOption(pcVar8,pcVar1);
                    if (!bVar5) {
                      pcVar8 = (cmDocumentation *)local_80;
                      std::__cxx11::string::operator=((string *)pcVar8,pcVar1);
                      iVar10 = iVar7;
                    }
                  }
                  iVar7 = iVar10 + 1;
                  if (iVar7 < argc) {
                    pcVar1 = argv[iVar7];
                    bVar5 = IsOption(pcVar8,pcVar1);
                    if (!bVar5) {
                      std::__cxx11::string::operator=((string *)(local_a8 + 8),pcVar1);
                      iVar10 = iVar7;
                    }
                  }
                  cmsys::SystemTools::LowerCase(&local_60,(string *)local_80);
                  std::__cxx11::string::operator=((string *)local_80,(string *)&local_60);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_60._M_dataplus._M_p != &local_60.field_2) {
                    operator_delete(local_60._M_dataplus._M_p,
                                    local_60.field_2._M_allocated_capacity + 1);
                  }
                  WarnFormFromFilename((RequestedHelpItem *)local_a8,&local_a9);
                }
                else {
                  pcVar8 = pcVar9;
                  iVar7 = strcmp((char *)pcVar9,"--help-module");
                  if (iVar7 == 0) {
                    local_a8._0_4_ = OneModule;
                    iVar7 = iVar10 + 1;
                    if (iVar7 < argc) {
                      pcVar1 = argv[iVar7];
                      bVar5 = IsOption(pcVar8,pcVar1);
                      if (!bVar5) {
                        pcVar8 = (cmDocumentation *)local_80;
                        std::__cxx11::string::operator=((string *)pcVar8,pcVar1);
                        iVar10 = iVar7;
                      }
                    }
                    iVar7 = iVar10 + 1;
                    if (iVar7 < argc) {
                      pcVar1 = argv[iVar7];
                      bVar5 = IsOption(pcVar8,pcVar1);
                      if (!bVar5) {
                        std::__cxx11::string::operator=((string *)(local_a8 + 8),pcVar1);
                        iVar10 = iVar7;
                      }
                    }
                    WarnFormFromFilename((RequestedHelpItem *)local_a8,&local_a9);
                  }
                  else {
                    pcVar8 = pcVar9;
                    iVar7 = strcmp((char *)pcVar9,"--help-property");
                    if (iVar7 == 0) {
                      local_a8._0_4_ = OneProperty;
                      iVar7 = iVar10 + 1;
                      if (iVar7 < argc) {
                        pcVar1 = argv[iVar7];
                        bVar5 = IsOption(pcVar8,pcVar1);
                        if (!bVar5) {
                          pcVar8 = (cmDocumentation *)local_80;
                          std::__cxx11::string::operator=((string *)pcVar8,pcVar1);
                          iVar10 = iVar7;
                        }
                      }
                      iVar7 = iVar10 + 1;
                      if (iVar7 < argc) {
                        pcVar1 = argv[iVar7];
                        bVar5 = IsOption(pcVar8,pcVar1);
                        if (!bVar5) {
                          std::__cxx11::string::operator=((string *)(local_a8 + 8),pcVar1);
                          iVar10 = iVar7;
                        }
                      }
                      WarnFormFromFilename((RequestedHelpItem *)local_a8,&local_a9);
                    }
                    else {
                      pcVar8 = pcVar9;
                      iVar7 = strcmp((char *)pcVar9,"--help-policy");
                      if (iVar7 == 0) {
                        local_a8._0_4_ = OnePolicy;
                        iVar7 = iVar10 + 1;
                        if (iVar7 < argc) {
                          pcVar1 = argv[iVar7];
                          bVar5 = IsOption(pcVar8,pcVar1);
                          if (!bVar5) {
                            pcVar8 = (cmDocumentation *)local_80;
                            std::__cxx11::string::operator=((string *)pcVar8,pcVar1);
                            iVar10 = iVar7;
                          }
                        }
                        iVar7 = iVar10 + 1;
                        if (iVar7 < argc) {
                          pcVar1 = argv[iVar7];
                          bVar5 = IsOption(pcVar8,pcVar1);
                          if (!bVar5) {
                            std::__cxx11::string::operator=((string *)(local_a8 + 8),pcVar1);
                            iVar10 = iVar7;
                          }
                        }
                        WarnFormFromFilename((RequestedHelpItem *)local_a8,&local_a9);
                      }
                      else {
                        pcVar8 = pcVar9;
                        iVar7 = strcmp((char *)pcVar9,"--help-variable");
                        if (iVar7 == 0) {
                          local_a8._0_4_ = OneVariable;
                          iVar7 = iVar10 + 1;
                          if (iVar7 < argc) {
                            pcVar1 = argv[iVar7];
                            bVar5 = IsOption(pcVar8,pcVar1);
                            if (!bVar5) {
                              pcVar8 = (cmDocumentation *)local_80;
                              std::__cxx11::string::operator=((string *)pcVar8,pcVar1);
                              iVar10 = iVar7;
                            }
                          }
                          iVar7 = iVar10 + 1;
                          if (iVar7 < argc) {
                            pcVar1 = argv[iVar7];
                            bVar5 = IsOption(pcVar8,pcVar1);
                            if (!bVar5) {
                              std::__cxx11::string::operator=((string *)(local_a8 + 8),pcVar1);
                              iVar10 = iVar7;
                            }
                          }
                          WarnFormFromFilename((RequestedHelpItem *)local_a8,&local_a9);
                        }
                        else {
                          pcVar8 = pcVar9;
                          iVar7 = strcmp((char *)pcVar9,"--help-manual");
                          if (iVar7 == 0) {
                            local_a8._0_4_ = OneManual;
                            iVar7 = iVar10 + 1;
                            if (iVar7 < argc) {
                              pcVar1 = argv[iVar7];
                              bVar5 = IsOption(pcVar8,pcVar1);
                              if (!bVar5) {
                                pcVar8 = (cmDocumentation *)local_80;
                                std::__cxx11::string::operator=((string *)pcVar8,pcVar1);
                                iVar10 = iVar7;
                              }
                            }
                            iVar7 = iVar10 + 1;
                            if (iVar7 < argc) {
                              pcVar1 = argv[iVar7];
                              bVar5 = IsOption(pcVar8,pcVar1);
                              if (!bVar5) {
                                std::__cxx11::string::operator=((string *)(local_a8 + 8),pcVar1);
                                iVar10 = iVar7;
                              }
                            }
                            WarnFormFromFilename((RequestedHelpItem *)local_a8,&local_a9);
                          }
                          else {
                            pcVar8 = pcVar9;
                            iVar7 = strcmp((char *)pcVar9,"--help-command-list");
                            if (iVar7 == 0) {
                              local_a8._0_4_ = ListCommands;
                              iVar7 = iVar10 + 1;
                              if (iVar7 < argc) {
                                pcVar1 = argv[iVar7];
                                bVar5 = IsOption(pcVar8,pcVar1);
                                if (!bVar5) {
                                  std::__cxx11::string::operator=((string *)(local_a8 + 8),pcVar1);
                                  iVar10 = iVar7;
                                }
                              }
                            }
                            else {
                              pcVar8 = pcVar9;
                              iVar7 = strcmp((char *)pcVar9,"--help-module-list");
                              if (iVar7 == 0) {
                                local_a8._0_4_ = ListModules;
                                iVar7 = iVar10 + 1;
                                if (iVar7 < argc) {
                                  pcVar1 = argv[iVar7];
                                  bVar5 = IsOption(pcVar8,pcVar1);
                                  if (!bVar5) {
                                    std::__cxx11::string::operator=((string *)(local_a8 + 8),pcVar1)
                                    ;
                                    iVar10 = iVar7;
                                  }
                                }
                              }
                              else {
                                pcVar8 = pcVar9;
                                iVar7 = strcmp((char *)pcVar9,"--help-property-list");
                                if (iVar7 == 0) {
                                  local_a8._0_4_ = ListProperties;
                                  iVar7 = iVar10 + 1;
                                  if (iVar7 < argc) {
                                    pcVar1 = argv[iVar7];
                                    bVar5 = IsOption(pcVar8,pcVar1);
                                    if (!bVar5) {
                                      std::__cxx11::string::operator=
                                                ((string *)(local_a8 + 8),pcVar1);
                                      iVar10 = iVar7;
                                    }
                                  }
                                }
                                else {
                                  pcVar8 = pcVar9;
                                  iVar7 = strcmp((char *)pcVar9,"--help-variable-list");
                                  if (iVar7 == 0) {
                                    local_a8._0_4_ = ListVariables;
                                    iVar7 = iVar10 + 1;
                                    if (iVar7 < argc) {
                                      pcVar1 = argv[iVar7];
                                      bVar5 = IsOption(pcVar8,pcVar1);
                                      if (!bVar5) {
                                        std::__cxx11::string::operator=
                                                  ((string *)(local_a8 + 8),pcVar1);
                                        iVar10 = iVar7;
                                      }
                                    }
                                  }
                                  else {
                                    pcVar8 = pcVar9;
                                    iVar7 = strcmp((char *)pcVar9,"--help-policy-list");
                                    if (iVar7 == 0) {
                                      local_a8._0_4_ = ListPolicies;
                                      iVar7 = iVar10 + 1;
                                      if (iVar7 < argc) {
                                        pcVar1 = argv[iVar7];
                                        bVar5 = IsOption(pcVar8,pcVar1);
                                        if (!bVar5) {
                                          std::__cxx11::string::operator=
                                                    ((string *)(local_a8 + 8),pcVar1);
                                          iVar10 = iVar7;
                                        }
                                      }
                                    }
                                    else {
                                      pcVar8 = pcVar9;
                                      iVar7 = strcmp((char *)pcVar9,"--help-manual-list");
                                      if (iVar7 == 0) {
                                        local_a8._0_4_ = ListManuals;
                                        iVar7 = iVar10 + 1;
                                        if (iVar7 < argc) {
                                          pcVar1 = argv[iVar7];
                                          bVar5 = IsOption(pcVar8,pcVar1);
                                          if (!bVar5) {
                                            std::__cxx11::string::operator=
                                                      ((string *)(local_a8 + 8),pcVar1);
                                            iVar10 = iVar7;
                                          }
                                        }
                                      }
                                      else {
                                        pcVar8 = pcVar9;
                                        iVar7 = strcmp((char *)pcVar9,"--copyright");
                                        if (iVar7 == 0) {
                                          iVar7 = iVar10 + 1;
                                          if (iVar7 < argc) {
                                            pcVar1 = argv[iVar7];
                                            bVar5 = IsOption(pcVar8,pcVar1);
                                            if (!bVar5) {
                                              std::__cxx11::string::operator=
                                                        ((string *)(local_a8 + 8),pcVar1);
                                              iVar10 = iVar7;
                                            }
                                          }
                                          bVar5 = false;
                                          cmSystemTools::Message
                                                    ("Warning: --copyright no longer supported",
                                                     (char *)0x0);
                                          goto LAB_0025d359;
                                        }
                                        pcVar8 = pcVar9;
                                        iVar7 = strcmp((char *)pcVar9,"--version");
                                        if (((iVar7 == 0) ||
                                            (pcVar8 = pcVar9,
                                            iVar7 = strcmp((char *)pcVar9,"-version"), iVar7 == 0))
                                           || (iVar7 = strcmp((char *)pcVar9,"/V"), pcVar8 = pcVar9,
                                              iVar7 == 0)) {
                                          local_a8._0_4_ = Version;
                                          iVar7 = iVar10 + 1;
                                          if (iVar7 < argc) {
                                            pcVar1 = argv[iVar7];
                                            bVar5 = IsOption(pcVar8,pcVar1);
                                            if (!bVar5) {
                                              std::__cxx11::string::operator=
                                                        ((string *)(local_a8 + 8),pcVar1);
                                              iVar10 = iVar7;
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
                goto LAB_0025d33b;
              }
              iVar7 = iVar10 + 1;
              if (iVar7 < argc) {
                pcVar1 = argv[iVar7];
                bVar5 = IsOption(pcVar8,pcVar1);
                if (!bVar5) {
                  std::__cxx11::string::operator=((string *)(local_a8 + 8),pcVar1);
                  iVar10 = iVar7;
                }
              }
              bVar5 = false;
              cmSystemTools::Message("Warning: --help-man no longer supported",(char *)0x0);
            }
          }
        }
LAB_0025d359:
        if ((undefined1 *)local_80._0_8_ != local_80 + 0x10) {
          operator_delete((void *)local_80._0_8_,CONCAT71(local_80._17_7_,local_80[0x10]) + 1);
        }
        if (local_a0._M_dataplus._M_p != local_a8 + 0x18) {
          operator_delete(local_a0._M_dataplus._M_p,
                          CONCAT71(local_a0.field_2._M_allocated_capacity._1_7_,
                                   local_a0.field_2._M_local_buf[0]) + 1);
        }
        if (!bVar5) break;
        iVar10 = iVar10 + 1;
        bVar2 = iVar10 < argc;
      } while (iVar10 < argc);
      bVar6 = 1;
    }
LAB_0025dc3d:
    if (bVar2) {
      local_a9 = (bool)bVar6;
    }
  }
  return (bool)(local_a9 & 1);
}

Assistant:

bool cmDocumentation::CheckOptions(int argc, const char* const* argv,
                                   const char* exitOpt)
{
  // Providing zero arguments gives usage information.
  if (argc == 1) {
    RequestedHelpItem help;
    help.HelpType = cmDocumentation::Usage;
    this->RequestedHelpItems.push_back(help);
    return true;
  }

  // Search for supported help options.

  bool result = false;
  for (int i = 1; i < argc; ++i) {
    if (exitOpt && strcmp(argv[i], exitOpt) == 0) {
      return result;
    }
    RequestedHelpItem help;
    // Check if this is a supported help option.
    if ((strcmp(argv[i], "-help") == 0) || (strcmp(argv[i], "--help") == 0) ||
        (strcmp(argv[i], "/?") == 0) || (strcmp(argv[i], "-usage") == 0) ||
        (strcmp(argv[i], "-h") == 0) || (strcmp(argv[i], "-H") == 0)) {
      help.HelpType = cmDocumentation::Help;
      GET_OPT_ARGUMENT(help.Argument);
      help.Argument = cmSystemTools::LowerCase(help.Argument);
      // special case for single command
      if (!help.Argument.empty()) {
        help.HelpType = cmDocumentation::OneCommand;
      }
    } else if (strcmp(argv[i], "--help-properties") == 0) {
      help.HelpType = cmDocumentation::OneManual;
      help.Argument = "cmake-properties.7";
      GET_OPT_ARGUMENT(help.Filename);
      this->WarnFormFromFilename(help, result);
    } else if (strcmp(argv[i], "--help-policies") == 0) {
      help.HelpType = cmDocumentation::OneManual;
      help.Argument = "cmake-policies.7";
      GET_OPT_ARGUMENT(help.Filename);
      this->WarnFormFromFilename(help, result);
    } else if (strcmp(argv[i], "--help-variables") == 0) {
      help.HelpType = cmDocumentation::OneManual;
      help.Argument = "cmake-variables.7";
      GET_OPT_ARGUMENT(help.Filename);
      this->WarnFormFromFilename(help, result);
    } else if (strcmp(argv[i], "--help-modules") == 0) {
      help.HelpType = cmDocumentation::OneManual;
      help.Argument = "cmake-modules.7";
      GET_OPT_ARGUMENT(help.Filename);
      this->WarnFormFromFilename(help, result);
    } else if (strcmp(argv[i], "--help-custom-modules") == 0) {
      GET_OPT_ARGUMENT(help.Filename);
      cmSystemTools::Message(
        "Warning: --help-custom-modules no longer supported");
      if (help.Filename.empty()) {
        return true;
      }
      // Avoid breaking old project builds completely by at least generating
      // the output file.  Abuse help.Argument to give the file name to
      // PrintOldCustomModules without disrupting our internal API.
      help.HelpType = cmDocumentation::OldCustomModules;
      help.Argument = cmSystemTools::GetFilenameName(help.Filename);
    } else if (strcmp(argv[i], "--help-commands") == 0) {
      help.HelpType = cmDocumentation::OneManual;
      help.Argument = "cmake-commands.7";
      GET_OPT_ARGUMENT(help.Filename);
      this->WarnFormFromFilename(help, result);
    } else if (strcmp(argv[i], "--help-compatcommands") == 0) {
      GET_OPT_ARGUMENT(help.Filename);
      cmSystemTools::Message(
        "Warning: --help-compatcommands no longer supported");
      return true;
    } else if (strcmp(argv[i], "--help-full") == 0) {
      help.HelpType = cmDocumentation::Full;
      GET_OPT_ARGUMENT(help.Filename);
      this->WarnFormFromFilename(help, result);
    } else if (strcmp(argv[i], "--help-html") == 0) {
      GET_OPT_ARGUMENT(help.Filename);
      cmSystemTools::Message("Warning: --help-html no longer supported");
      return true;
    } else if (strcmp(argv[i], "--help-man") == 0) {
      GET_OPT_ARGUMENT(help.Filename);
      cmSystemTools::Message("Warning: --help-man no longer supported");
      return true;
    } else if (strcmp(argv[i], "--help-command") == 0) {
      help.HelpType = cmDocumentation::OneCommand;
      GET_OPT_ARGUMENT(help.Argument);
      GET_OPT_ARGUMENT(help.Filename);
      help.Argument = cmSystemTools::LowerCase(help.Argument);
      this->WarnFormFromFilename(help, result);
    } else if (strcmp(argv[i], "--help-module") == 0) {
      help.HelpType = cmDocumentation::OneModule;
      GET_OPT_ARGUMENT(help.Argument);
      GET_OPT_ARGUMENT(help.Filename);
      this->WarnFormFromFilename(help, result);
    } else if (strcmp(argv[i], "--help-property") == 0) {
      help.HelpType = cmDocumentation::OneProperty;
      GET_OPT_ARGUMENT(help.Argument);
      GET_OPT_ARGUMENT(help.Filename);
      this->WarnFormFromFilename(help, result);
    } else if (strcmp(argv[i], "--help-policy") == 0) {
      help.HelpType = cmDocumentation::OnePolicy;
      GET_OPT_ARGUMENT(help.Argument);
      GET_OPT_ARGUMENT(help.Filename);
      this->WarnFormFromFilename(help, result);
    } else if (strcmp(argv[i], "--help-variable") == 0) {
      help.HelpType = cmDocumentation::OneVariable;
      GET_OPT_ARGUMENT(help.Argument);
      GET_OPT_ARGUMENT(help.Filename);
      this->WarnFormFromFilename(help, result);
    } else if (strcmp(argv[i], "--help-manual") == 0) {
      help.HelpType = cmDocumentation::OneManual;
      GET_OPT_ARGUMENT(help.Argument);
      GET_OPT_ARGUMENT(help.Filename);
      this->WarnFormFromFilename(help, result);
    } else if (strcmp(argv[i], "--help-command-list") == 0) {
      help.HelpType = cmDocumentation::ListCommands;
      GET_OPT_ARGUMENT(help.Filename);
    } else if (strcmp(argv[i], "--help-module-list") == 0) {
      help.HelpType = cmDocumentation::ListModules;
      GET_OPT_ARGUMENT(help.Filename);
    } else if (strcmp(argv[i], "--help-property-list") == 0) {
      help.HelpType = cmDocumentation::ListProperties;
      GET_OPT_ARGUMENT(help.Filename);
    } else if (strcmp(argv[i], "--help-variable-list") == 0) {
      help.HelpType = cmDocumentation::ListVariables;
      GET_OPT_ARGUMENT(help.Filename);
    } else if (strcmp(argv[i], "--help-policy-list") == 0) {
      help.HelpType = cmDocumentation::ListPolicies;
      GET_OPT_ARGUMENT(help.Filename);
    } else if (strcmp(argv[i], "--help-manual-list") == 0) {
      help.HelpType = cmDocumentation::ListManuals;
      GET_OPT_ARGUMENT(help.Filename);
    } else if (strcmp(argv[i], "--copyright") == 0) {
      GET_OPT_ARGUMENT(help.Filename);
      cmSystemTools::Message("Warning: --copyright no longer supported");
      return true;
    } else if ((strcmp(argv[i], "--version") == 0) ||
               (strcmp(argv[i], "-version") == 0) ||
               (strcmp(argv[i], "/V") == 0)) {
      help.HelpType = cmDocumentation::Version;
      GET_OPT_ARGUMENT(help.Filename);
    }
    if (help.HelpType != None) {
      // This is a help option.  See if there is a file name given.
      result = true;
      this->RequestedHelpItems.push_back(help);
    }
  }
  return result;
}